

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

Value * __thiscall
anon_unknown.dwarf_21f857c::CodemodelConfig::Dump
          (Value *__return_storage_ptr__,CodemodelConfig *this)

{
  pointer *ppDVar1;
  pointer *ppPVar2;
  cmStateSnapshot *this_00;
  uint uVar3;
  _Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_> _Var4;
  pointer pDVar5;
  pointer __first;
  cmMakefile *pcVar6;
  pointer puVar7;
  cmInstallGenerator *pcVar8;
  long *plVar9;
  ValueHolder VVar10;
  pointer pcVar11;
  cmFileAPI *this_01;
  undefined8 *puVar12;
  pointer pPVar13;
  undefined8 uVar14;
  anon_struct_4_2_14fb5ae2_for_bits_ *paVar15;
  bool bVar16;
  int iVar17;
  TargetType TVar18;
  ArrayIndex AVar19;
  Value *pVVar20;
  pointer __result;
  pointer pDVar21;
  pointer pDVar22;
  mapped_type_conflict3 *pmVar23;
  iterator iVar24;
  ulong uVar25;
  ValueHolder *pVVar26;
  ulong uVar27;
  cmGlobalGenerator *pcVar28;
  string *psVar29;
  cmLocalGenerator *this_02;
  mapped_type *pmVar30;
  cmValue value;
  Value *extraout_RAX;
  _Tp_alloc_type *p_Var31;
  ValueHolder VVar32;
  long lVar33;
  ValueHolder VVar34;
  pointer pPVar35;
  ValueHolder *pVVar36;
  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
  *p_Var37;
  ulong uVar38;
  pointer pDVar39;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  ValueHolder *pVVar40;
  pointer puVar41;
  long *plVar42;
  long lVar43;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar44;
  undefined8 *puVar45;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  Value childIndexes;
  string buildDir;
  string prefix_1;
  cmStateSnapshot ps;
  string sourceDir;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  string buildDirRel;
  string prefix;
  Target t;
  ValueHolder local_4f8;
  ValueHolder VStack_4f0;
  undefined1 local_4e8 [40];
  pointer local_4c0;
  ValueHolder *local_4b8;
  _Base_ptr local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  ValueHolder local_458 [4];
  ValueHolder local_438;
  ValueHolder *local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418 [2];
  ValueHolder local_3f8;
  ValueHolder VStack_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  pointer local_3d0;
  Value *local_3c8;
  ValueHolder local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  ValueHolder local_3a8;
  ValueHolder *local_390;
  ValueHolder local_388;
  ValueHolder VStack_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  ValueHolder local_368;
  long local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  char *local_340;
  _Base_ptr local_338;
  ValueHolder *local_330;
  ulong local_328;
  ValueHolder *local_320;
  ulong local_318;
  long local_310;
  ValueHolder local_308;
  ValueHolder VStack_300;
  ValueHolder local_2f8;
  undefined1 local_2f0 [32];
  ValueHolder local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0 [8];
  undefined1 local_2b8 [24];
  BacktraceData local_2a0;
  undefined4 local_158 [2];
  undefined8 local_150;
  undefined4 *local_148;
  undefined4 *local_140;
  undefined8 local_138;
  _Base_ptr *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined4 local_110;
  undefined8 local_108;
  _Base_ptr p_Stack_100;
  Value local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a0;
  undefined8 uStack_90;
  undefined8 local_88;
  _Base_ptr *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined4 local_60;
  undefined8 local_58;
  _Base_ptr p_Stack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_3c8 = __return_storage_ptr__;
  Json::Value::Value((Value *)&local_308,this->Config);
  pVVar20 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar20,(Value *)&local_308);
  Json::Value::~Value((Value *)&local_308);
  _Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  VVar32 = (ValueHolder)
           ((ValueHolder *)
           ((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0x98))->
           map_;
  pVVar26 = *(ValueHolder **)
             ((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0xa0);
  p_Var37 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)((long)pVVar26 - (long)VVar32 >> 3);
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)0x199999999999999 < p_Var37) {
    local_340 = "vector::reserve";
LAB_0052c6c8:
    std::__throw_length_error(local_340);
  }
  pDVar21 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var31 = (_Tp_alloc_type *)0xcccccccccccccccd;
  if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
       *)(((long)(this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar21 >> 4) *
         -0x3333333333333333) < p_Var37) {
    pDVar39 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
               ::_M_allocate(p_Var37,(size_t)pVVar26);
    std::
    vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ::_S_relocate((this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_finish,__result,p_Var31);
    pDVar5 = (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pDVar5 != (pointer)0x0) {
      operator_delete(pDVar5,(long)(this->Directories).
                                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar5
                     );
    }
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(((long)pDVar39 - (long)pDVar21) + (long)__result);
    (this->Directories).
    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)p_Var37;
    VVar32 = (ValueHolder)
             ((ValueHolder *)
             ((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0x98))->
             map_;
    pVVar26 = *(ValueHolder **)
               ((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 0xa0);
    pDVar21 = __result;
  }
  local_390 = pVVar26;
  if (VVar32 != pVVar26) {
    local_4b0 = (_Base_ptr)&this->DirectoryMap;
    local_3d0 = (pointer)&this->ProjectMap;
    local_338 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_310 = 0x7fffffffffffffd0;
    local_340 = "vector::_M_realloc_insert";
    pVVar36 = pVVar26;
    do {
      __first = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar22 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar33 = (long)pDVar22 - (long)__first;
      local_4c0 = (pointer)((lVar33 >> 4) * -0x3333333333333333);
      if (pDVar22 ==
          (this->Directories).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if (lVar33 == local_310) goto LAB_0052c6c8;
        pDVar21 = local_4c0;
        if (pDVar22 == __first) {
          pDVar21 = (pointer)0x1;
        }
        p_Var37 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   *)((long)pDVar21 + (long)local_4c0);
        p_Var31 = (_Tp_alloc_type *)0x199999999999999;
        if ((_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             *)0x199999999999998 < p_Var37) {
          p_Var37 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        if (CARRY8((ulong)pDVar21,(ulong)local_4c0)) {
          p_Var37 = (_Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                     *)0x199999999999999;
        }
        pDVar21 = std::
                  _Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_M_allocate(p_Var37,(size_t)pVVar26);
        this_00 = (cmStateSnapshot *)((long)pDVar21 + lVar33);
        puVar45 = (undefined8 *)((long)&pDVar21->TargetIndexes + lVar33 + 0x20);
        *puVar45 = 0;
        puVar45[1] = 0;
        puVar45 = (undefined8 *)((long)&pDVar21->TargetIndexes + lVar33 + 0x10);
        *puVar45 = 0;
        puVar45[1] = 0;
        puVar45 = (undefined8 *)((long)&pDVar21->TargetIndexes + lVar33);
        *puVar45 = 0;
        puVar45[1] = 0;
        puVar45 = (undefined8 *)((long)&pDVar21->Snapshot + lVar33 + 0x10);
        *puVar45 = 0;
        puVar45[1] = 0;
        *(undefined8 *)((long)pDVar21 + lVar33) = 0;
        ((undefined8 *)((long)pDVar21 + lVar33))[1] = 0;
        local_438 = VVar32;
        cmStateSnapshot::cmStateSnapshot(this_00,(cmState *)0x0);
        this_00[1].State = (cmState *)0x0;
        Json::Value::Value((Value *)&this_00[1].Position,arrayValue);
        *(undefined1 *)((long)&this_00[3].State + 4) = 0;
        pDVar22 = std::
                  vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ::_S_relocate(__first,pDVar22,pDVar21,p_Var31);
        if (__first != (pointer)0x0) {
          operator_delete(__first,(long)(this->Directories).
                                        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__first);
        }
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_start = pDVar21;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_finish = pDVar22 + 1;
        (this->Directories).
        super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar21 + (long)p_Var37;
        VVar32 = local_438;
        pVVar36 = local_390;
      }
      else {
        (pDVar22->TargetIndexes).limit_ = 0;
        pDVar22->ProjectIndex = 0;
        pDVar22->HasInstallRule = false;
        *(undefined3 *)&pDVar22->field_0x4d = 0;
        (pDVar22->TargetIndexes).comments_.ptr_._M_t.
        super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        .
        super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
        ._M_head_impl =
             (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)0x0;
        (pDVar22->TargetIndexes).start_ = 0;
        (pDVar22->TargetIndexes).value_.int_ = 0;
        *(undefined8 *)&(pDVar22->TargetIndexes).bits_ = 0;
        (pDVar22->Snapshot).Position.Position = 0;
        pDVar22->LocalGenerator = (cmLocalGenerator *)0x0;
        (pDVar22->Snapshot).State = (cmState *)0x0;
        (pDVar22->Snapshot).Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
        cmStateSnapshot::cmStateSnapshot(&pDVar22->Snapshot,(cmState *)0x0);
        pDVar22->LocalGenerator = (cmLocalGenerator *)0x0;
        Json::Value::Value(&pDVar22->TargetIndexes,arrayValue);
        pDVar22->HasInstallRule = false;
        ppDVar1 = &(this->Directories).
                   super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
        pDVar21 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      cmLocalGenerator::GetStateSnapshot
                ((cmStateSnapshot *)&local_4f8,*(cmLocalGenerator **)VVar32.string_);
      cmStateSnapshot::GetBuildsystemDirectory
                ((cmStateSnapshot *)&local_308,(cmStateSnapshot *)&local_4f8);
      local_430 = (ValueHolder *)(pDVar21 + ((ulong)local_4c0 & 0xffffffff));
      local_430[2] = local_2f8;
      *local_430 = local_308;
      local_430[1] = VStack_300;
      local_430[3].map_ = (ObjectValues *)*(cmLocalGenerator **)VVar32.string_;
      pmVar23 = std::
                map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                              *)local_4b0,(key_type *)local_430);
      *pmVar23 = (mapped_type_conflict3)local_4c0;
      local_418[0]._0_8_ = local_430[2];
      local_428._M_allocated_capacity = (size_type)*local_430;
      local_428._8_8_ = local_430[1];
      local_3b8._M_allocated_capacity = local_428._M_allocated_capacity;
      local_3b8._8_8_ = local_428._8_8_;
      local_3a8 = (ValueHolder)local_418[0]._0_8_;
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_468,(cmStateSnapshot *)&local_428);
      bVar16 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_468);
      if (bVar16) {
        cmStateSnapshot::GetProjectName_abi_cxx11_
                  ((string *)&local_308,(cmStateSnapshot *)&local_468);
        cmStateSnapshot::GetProjectName_abi_cxx11_
                  ((string *)&local_4f8,(cmStateSnapshot *)&local_428);
        VVar34 = local_4f8;
        if (VStack_300.int_ == VStack_4f0.int_) {
          if (VStack_300 == (cmGeneratorTarget *)0x0) {
            bVar16 = true;
          }
          else {
            iVar17 = bcmp(local_308.string_,local_4f8.string_,VStack_300.uint_);
            bVar16 = iVar17 == 0;
          }
        }
        else {
          bVar16 = false;
        }
        if (VVar34 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4e8) {
          operator_delete(VVar34.string_,local_4e8._0_8_ + 1);
        }
        if (local_308 != &local_2f8) {
          operator_delete(local_308.string_,(ulong)(local_2f8.int_ + 1));
        }
        if (!bVar16) goto LAB_0052ad2a;
        local_2f8 = local_458[0];
        local_308 = (ValueHolder)local_468._M_allocated_capacity;
        VStack_300 = (ValueHolder)local_468._8_8_;
        iVar24 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(local_4b0,(key_type *)&local_308);
        if (iVar24._M_node == local_338) goto LAB_0052c69a;
        AVar19 = (this->Directories).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                 ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar24._M_node[1]._M_right].
                 ProjectIndex;
      }
      else {
LAB_0052ad2a:
        VVar34 = (ValueHolder)
                 (this->Projects).
                 super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar26 = (ValueHolder *)
                  (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar33 = (long)pVVar26 - (long)VVar34 >> 3;
        uVar27 = lVar33 * -0x79435e50d79435e5;
        if (pVVar26 ==
            (ValueHolder *)
            (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)pVVar26 - (long)VVar34 == 0x7fffffffffffffc8) goto LAB_0052c6c8;
          uVar25 = uVar27;
          if (pVVar26 == (ValueHolder *)VVar34.int_) {
            uVar25 = 1;
          }
          uVar38 = uVar25 + uVar27;
          if (0xd79435e50d7942 < uVar38) {
            uVar38 = 0xd79435e50d7943;
          }
          if (CARRY8(uVar25,uVar27)) {
            uVar38 = 0xd79435e50d7943;
          }
          local_4b8 = pVVar26;
          local_3c0 = VVar34;
          if (uVar38 == 0) {
            pVVar26 = (ValueHolder *)0x0;
          }
          else {
            pVVar26 = (ValueHolder *)operator_new(uVar38 * 0x98);
          }
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>
                    ((allocator_type *)&pVVar26[lVar33].bool_,(Project *)VVar34.map_);
          VVar34 = local_3c0;
          pVVar40 = pVVar26;
          pVVar36 = pVVar26;
          if (local_4b8 != local_3c0) {
            do {
              local_318 = uVar27;
              local_320 = pVVar36;
              local_328 = uVar38;
              local_438 = VVar32;
              VVar32.int_ = *VVar34.int_;
              VVar10 = *(ValueHolder *)
                        &((anon_struct_4_2_14fb5ae2_for_bits_ *)
                         ((ValueHolder *)&(VVar34.map_)->_M_t + 1))->field_0x0;
              uVar14 = *(undefined8 *)((long)&(VVar34.map_)->_M_t + 0x14);
              *(undefined8 *)((long)pVVar26 + 0xc) =
                   *(undefined8 *)((long)&(VVar34.map_)->_M_t + 0xc);
              *(undefined8 *)((long)pVVar26 + 0x14) = uVar14;
              *pVVar26 = VVar32;
              pVVar26[1] = VVar10;
              Json::Value::Value((Value *)(pVVar26 + 4),
                                 (Value *)((ValueHolder *)&(VVar34.map_)->_M_t + 4));
              Json::Value::Value((Value *)(pVVar26 + 9),(Value *)(VVar34.int_ + 0x48));
              Json::Value::Value((Value *)(pVVar26 + 0xe),(Value *)(VVar34.int_ + 0x70));
              Json::Value::~Value((Value *)(VVar34.int_ + 0x70));
              Json::Value::~Value((Value *)(VVar34.int_ + 0x48));
              Json::Value::~Value((Value *)((ValueHolder *)&(VVar34.map_)->_M_t + 4));
              pVVar26 = pVVar26 + 0x13;
              VVar34.string_ = (char *)(VVar34.int_ + 0x98);
              VVar32 = local_438;
              uVar27 = local_318;
              uVar38 = local_328;
              pVVar40 = local_320;
              pVVar36 = local_320;
            } while ((ValueHolder *)VVar34.int_ != local_4b8);
          }
          if (local_3c0 != (ValueHolder *)0x0) {
            operator_delete(local_3c0.string_,
                            (long)(this->Projects).
                                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_3c0);
          }
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar40;
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pVVar26 + 0x13);
          (this->Projects).
          super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pVVar40 + uVar38 * 0x13);
          pVVar36 = local_390;
        }
        else {
          std::allocator_traits<std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>::
          construct<(anonymous_namespace)::CodemodelConfig::Project>
                    ((allocator_type *)&pVVar26->bool_,(Project *)VVar34.map_);
          ppPVar2 = &(this->Projects).
                     super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar2 = *ppPVar2 + 1;
          pVVar40 = (ValueHolder *)
                    (this->Projects).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        AVar19 = (ArrayIndex)uVar27;
        uVar27 = uVar27 & 0xffffffff;
        pVVar40[uVar27 * 0x13 + 2] = (ValueHolder)local_418[0]._0_8_;
        pVVar40[uVar27 * 0x13] = (ValueHolder)local_428._M_allocated_capacity;
        (pVVar40 + uVar27 * 0x13)[1] = (ValueHolder)local_428._8_8_;
        pmVar23 = std::
                  map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                  ::operator[]((map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                                *)local_3d0,(key_type *)&local_428);
        *pmVar23 = AVar19;
        bVar16 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_468);
        if (bVar16) {
          local_2f8 = local_458[0];
          local_308 = (ValueHolder)local_468._M_allocated_capacity;
          VStack_300 = (ValueHolder)local_468._8_8_;
          iVar24 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(local_4b0,(key_type *)&local_308);
          if (iVar24._M_node == local_338) goto LAB_0052c69a;
          uVar3 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar24._M_node[1]._M_right].
                  ProjectIndex;
          *(uint *)(pVVar40 + uVar27 * 0x13 + 3) = uVar3;
          pPVar35 = (this->Projects).
                    super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Json::Value::Value((Value *)&local_308,AVar19);
          Json::Value::append(&pPVar35[uVar3].ChildIndexes,(Value *)&local_308);
          Json::Value::~Value((Value *)&local_308);
        }
      }
      *(ArrayIndex *)(local_430 + 9) = AVar19;
      pPVar35 = (this->Projects).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Json::Value::Value((Value *)&local_308,(UInt)local_4c0);
      pVVar26 = &local_308;
      Json::Value::append(&pPVar35[AVar19].DirectoryIndexes,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      VVar32.string_ = (char *)((ValueHolder *)&(VVar32.map_)->_M_t + 1);
    } while ((ValueHolder *)VVar32.int_ != pVVar36);
    pDVar21 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  pDVar39 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar39 != pDVar21) {
    do {
      pcVar6 = (pDVar39[-1].LocalGenerator)->Makefile;
      puVar7 = (pcVar6->InstallGenerators).
               super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar41 = (pcVar6->InstallGenerators).
                     super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar41 != puVar7;
          puVar41 = puVar41 + 1) {
        pcVar8 = (puVar41->_M_t).
                 super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                 .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
        if ((pcVar8 == (cmInstallGenerator *)0x0) ||
           (lVar33 = __dynamic_cast(pcVar8,&cmInstallGenerator::typeinfo,
                                    &cmInstallSubdirectoryGenerator::typeinfo,0), lVar33 == 0)) {
          pDVar39[-1].HasInstallRule = true;
          break;
        }
      }
      pDVar21 = pDVar39 + -1;
      if (pDVar39[-1].HasInstallRule == false) {
        cmStateSnapshot::GetChildren
                  ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_4f8,
                   &pDVar21->Snapshot);
        VVar34 = VStack_4f0;
        for (VVar32 = local_4f8; VVar32.int_ != VVar34.int_;
            VVar32.string_ =
                 (char *)(&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&(VVar32.map_)->_M_t)->_M_allocated_capacity + 3)) {
          cmStateSnapshot::GetBuildsystemDirectory
                    ((cmStateSnapshot *)&local_468,(cmStateSnapshot *)VVar32.map_);
          local_2f8 = local_458[0];
          local_308 = (ValueHolder)local_468._M_allocated_capacity;
          VStack_300 = (ValueHolder)local_468._8_8_;
          iVar24 = std::
                   _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                   ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_308);
          if ((_Rb_tree_header *)iVar24._M_node ==
              &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header) goto LAB_0052c69a;
          if ((this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_start[*(uint *)&iVar24._M_node[1]._M_right].
              HasInstallRule == true) {
            pDVar39[-1].HasInstallRule = true;
            break;
          }
        }
        if (local_4f8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_4f8.string_,local_4e8._0_8_ - (long)local_4f8);
        }
      }
      pDVar39 = pDVar21;
    } while (pDVar21 !=
             (this->Directories).
             super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  Json::Value::Value((Value *)&local_3b8,arrayValue);
  local_3f8.int_ = 0;
  VStack_3f0.int_ = 0;
  local_3e8._M_allocated_capacity = 0;
  _Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (this->FileAPI->CMakeInstance->GlobalGenerator)._M_t.
       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
       super__Head_base<0UL,_cmGlobalGenerator_*,_false>;
  plVar42 = *(long **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                      0x98);
  plVar9 = *(long **)((long)_Var4.super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl +
                     0xa0);
  if (plVar42 != plVar9) {
    do {
      pVVar36 = *(ValueHolder **)(*plVar42 + 0x150);
      for (pVVar26 = *(ValueHolder **)(*plVar42 + 0x148); VVar34 = VStack_3f0, VVar32 = local_3f8,
          pVVar26 != pVVar36; pVVar26 = pVVar26 + 1) {
        local_308 = *pVVar26;
        std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
        emplace_back<cmGeneratorTarget*>
                  ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&local_3f8.bool_
                   ,(cmGeneratorTarget **)&local_308.map_);
      }
      plVar42 = plVar42 + 1;
    } while (plVar42 != plVar9);
    if (local_3f8.int_ != VStack_3f0.int_) {
      lVar43 = (long)VStack_3f0.string_ - (long)local_3f8;
      uVar27 = lVar43 >> 3;
      lVar33 = 0x3f;
      if (uVar27 != 0) {
        for (; uVar27 >> lVar33 == 0; lVar33 = lVar33 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                (local_3f8.int_,VStack_3f0.int_,((uint)lVar33 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar43 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (VVar32.int_,VVar34.int_);
      }
      else {
        paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(VVar32.int_ + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                  (VVar32.int_,paVar44);
        for (; paVar44 != VVar34;
            paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar44->_M_allocated_capacity + 1)) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CodemodelConfig::DumpTargets()::__0>>
                    (paVar44);
        }
      }
    }
  }
  if (local_3f8.int_ != VStack_3f0.int_) {
    local_4c0 = (pointer)&this->TopBuild;
    local_430 = (ValueHolder *)&this->DirectoryMap;
    local_4b0 = &(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_3d0 = (pointer)&this->TargetIndexMap;
    local_438.int_ = VStack_3f0.int_;
    VVar34 = local_3f8;
    VVar32 = VStack_3f0;
    do {
      VVar10.int_ = *VVar34.int_;
      TVar18 = cmGeneratorTarget::GetType((cmGeneratorTarget *)VVar10.map_);
      if ((TVar18 != GLOBAL_TARGET) && (bVar16 = cmGeneratorTarget::IsInBuildSystem(VVar10), bVar16)
         ) {
        AVar19 = Json::Value::size((Value *)&local_3b8);
        local_4b8 = (ValueHolder *)CONCAT44(local_4b8._4_4_,AVar19);
        VStack_300 = (ValueHolder)this->Config;
        local_388 = VVar10;
        local_308 = VVar10;
        pcVar28 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)VVar10.map_);
        psVar29 = cmake::GetHomeDirectory_abi_cxx11_(pcVar28->CMakeInstance);
        local_2f8.string_ = local_2f0 + 8;
        pcVar11 = (psVar29->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,pcVar11,pcVar11 + psVar29->_M_string_length);
        pcVar28 = cmGeneratorTarget::GetGlobalGenerator((cmGeneratorTarget *)VVar10.map_);
        psVar29 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar28->CMakeInstance);
        local_2f0._24_8_ = &local_2c8;
        pcVar11 = (psVar29->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_2f0 + 0x18),pcVar11,pcVar11 + psVar29->_M_string_length);
        std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                  ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)local_2b8,
                   (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)
                   (*(long *)&((anon_struct_4_2_14fb5ae2_for_bits_ *)
                              ((ValueHolder *)&(local_308.map_)->_M_t + 1))->field_0x0 + 0x2a8));
        local_4f8.string_ = local_4e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4f8,local_2f8.int_,
                   (pointer)(local_2f0._0_8_ + (long)local_2f8.string_));
        BacktraceData::BacktraceData(&local_2a0,(string *)&local_4f8);
        if (local_4f8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8) {
          operator_delete(local_4f8.string_,local_4e8._0_8_ + 1);
        }
        local_158[0] = 0;
        local_150 = 0;
        local_148 = local_158;
        local_138 = 0;
        local_130 = &p_Stack_100;
        local_128 = 1;
        local_120 = 0;
        uStack_118 = 0;
        local_110 = 0x3f800000;
        local_108 = 0;
        p_Stack_100 = (_Base_ptr)0x0;
        local_140 = local_148;
        Json::Value::Value(&local_f8,arrayValue);
        local_d0 = &aStack_a0;
        local_c8 = 1;
        local_c0 = 0;
        uStack_b8 = 0;
        local_b0 = 0x3f800000;
        local_88 = 0;
        aStack_a0._8_8_ = 0;
        uStack_90 = 0;
        local_a8 = 0;
        aStack_a0._M_allocated_capacity = 0;
        local_80 = &p_Stack_50;
        local_78 = 1;
        local_70 = 0;
        uStack_68 = 0;
        local_60 = 0x3f800000;
        local_38 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        p_Stack_50 = (_Base_ptr)0x0;
        psVar29 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)VVar10.map_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_368,"target-",psVar29);
        if (local_360 != 0) {
          lVar33 = 0;
          do {
            if ((local_368.string_[lVar33] == '\\') || (local_368.string_[lVar33] == '/')) {
              local_368.string_[lVar33] = '_';
            }
            lVar33 = lVar33 + 1;
          } while (local_360 != lVar33);
        }
        if (this->Config->_M_string_length != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_4f8,"-",this->Config);
          std::__cxx11::string::_M_append((char *)&local_368.int_,local_4f8.uint_);
          if (local_4f8 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8) {
            operator_delete(local_4f8.string_,local_4e8._0_8_ + 1);
          }
        }
        this_01 = this->FileAPI;
        Target::Dump((Value *)&local_4f8,(Target *)&local_308);
        cmFileAPI::MaybeJsonFile
                  ((Value *)&local_428,this_01,(Value *)&local_4f8,(string *)&local_368);
        Json::Value::~Value((Value *)&local_4f8);
        psVar29 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)VVar10.map_);
        Json::Value::Value((Value *)&local_468,psVar29);
        pVVar20 = Json::Value::operator[]((Value *)&local_428,"name");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        TargetId((string *)&local_4a8,(cmGeneratorTarget *)VVar10.map_,(string *)local_4c0);
        Json::Value::Value((Value *)&local_468,(String *)&local_4a8);
        pVVar20 = Json::Value::operator[]((Value *)&local_428,"id");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_allocated_capacity != &local_498) {
          operator_delete((void *)local_4a8._M_allocated_capacity,
                          (ulong)(local_498._M_allocated_capacity + 1));
        }
        this_02 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)VVar10.map_);
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)local_488,this_02);
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_4a8,(cmStateSnapshot *)local_488);
        local_458[0].map_ = (ObjectValues *)local_498._M_allocated_capacity;
        local_468._M_allocated_capacity = local_4a8._M_allocated_capacity;
        local_468._8_8_ = local_4a8._8_8_;
        iVar24 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find((_Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                         *)local_430,(key_type *)&local_468);
        if (iVar24._M_node == local_4b0) goto LAB_0052c69a;
        uVar3 = *(uint *)&iVar24._M_node[1]._M_right;
        Json::Value::Value((Value *)&local_468,uVar3);
        pVVar20 = Json::Value::operator[]((Value *)&local_428,"directoryIndex");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        pDVar21 = (this->Directories).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_468,(UInt)local_4b8);
        Json::Value::append(&pDVar21[uVar3].TargetIndexes,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        uVar3 = (this->Directories).
                super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar3].ProjectIndex;
        Json::Value::Value((Value *)&local_468,uVar3);
        pVVar20 = Json::Value::operator[]((Value *)&local_428,"projectIndex");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        pPVar35 = (this->Projects).
                  super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        Json::Value::Value((Value *)&local_468,(UInt)local_4b8);
        Json::Value::append(&pPVar35[uVar3].TargetIndexes,(Value *)&local_468);
        Json::Value::~Value((Value *)&local_468);
        pmVar30 = std::__detail::
                  _Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_unsigned_int>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_3d0,(key_type *)&local_388.map_);
        VVar32 = local_438;
        *pmVar30 = (UInt)local_4b8;
        if (local_368 != &local_358) {
          operator_delete(local_368.string_,local_358._M_allocated_capacity + 1);
        }
        Target::~Target((Target *)&local_308);
        Json::Value::append((Value *)&local_3b8,(Value *)&local_428);
        Json::Value::~Value((Value *)&local_428);
      }
      VVar34.string_ = (char *)((long)&(VVar34.map_)->_M_t + 8);
    } while (VVar34.int_ != VVar32.int_);
  }
  if (local_3f8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_3f8.string_,local_3e8._M_allocated_capacity - (long)local_3f8);
  }
  pVVar20 = Json::Value::operator[](local_3c8,"targets");
  Json::Value::operator=(pVVar20,(Value *)&local_3b8);
  Json::Value::~Value((Value *)&local_3b8);
  Json::Value::Value((Value *)&local_368,arrayValue);
  pDVar21 = (this->Directories).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_3d0 = (this->Directories).
              super__Vector_base<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar21 != local_3d0) {
    local_430 = (ValueHolder *)&this->TopSource;
    local_4b0 = (_Base_ptr)&this->TopBuild;
    local_3c0.string_ = (char *)&this->TargetIndexMap;
    local_4b8 = (ValueHolder *)&(this->DirectoryMap)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_488._0_8_ = local_488 + 0x10;
      local_478._M_allocated_capacity = 0x726f746365726964;
      local_478._M_local_buf[8] = 'y';
      local_488._8_8_ = &DAT_00000009;
      local_478._M_local_buf[9] = '\0';
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_308,&pDVar21->Snapshot);
      psVar29 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_308);
      cmSystemTools::RelativeIfUnder((string *)&local_3f8,(string *)local_430,psVar29);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_308,&pDVar21->Snapshot);
      psVar29 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_308);
      cmSystemTools::RelativeIfUnder((string *)&local_388,(string *)local_4b0,psVar29);
      bVar16 = cmsys::SystemTools::FileIsFullPath((string *)&local_388);
      if (bVar16) {
        bVar16 = cmsys::SystemTools::FileIsFullPath((string *)&local_3f8);
        if (!bVar16) {
          local_308.int_ = local_488._8_8_;
          VStack_300.string_ = (char *)local_488._0_8_;
          local_2f8.int_ = 0;
          local_4f8.int_ = 0;
          VStack_4f0.int_ = 1;
          local_4e8._0_8_ = local_4e8 + 8;
          local_4e8[8] = '-';
          local_2f0._0_8_ = (pointer)0x1;
          local_2f0._16_8_ = 0;
          local_2f0._24_8_ = VStack_3f0;
          local_2d0 = local_3f8;
          local_2c8 = 0;
          views._M_len = 3;
          views._M_array = (iterator)&local_308;
          local_2f0._8_8_ = local_4e8._0_8_;
          cmCatViews((string *)&local_468,views);
          goto LAB_0052bb61;
        }
      }
      else {
        local_308.int_ = local_488._8_8_;
        VStack_300.string_ = (char *)local_488._0_8_;
        local_2f8.int_ = 0;
        local_4f8.int_ = 0;
        VStack_4f0.int_ = 1;
        local_4e8._0_8_ = local_4e8 + 8;
        local_4e8[8] = '-';
        local_2f0._0_8_ = (pointer)0x1;
        local_2f0._16_8_ = 0;
        local_2f0._24_8_ = VStack_380;
        local_2d0 = local_388;
        local_2c8 = 0;
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_308;
        local_2f0._8_8_ = local_4e8._0_8_;
        cmCatViews((string *)&local_468,views_00);
LAB_0052bb61:
        std::__cxx11::string::operator=((string *)local_488,(string *)local_468._M_local_buf);
        if ((ValueHolder *)local_468._M_allocated_capacity != local_458) {
          operator_delete((void *)local_468._M_allocated_capacity,(ulong)(local_458[0].int_ + 1));
        }
      }
      if ((ValueHolder *)local_488._8_8_ != (ValueHolder *)0x0) {
        lVar33 = 0;
        do {
          if ((*(char *)(local_488._0_8_ + lVar33) == '\\') ||
             (*(char *)(local_488._0_8_ + lVar33) == '/')) {
            *(char *)(local_488._0_8_ + lVar33) = '.';
          }
          lVar33 = lVar33 + 1;
        } while (local_488._8_8_ != lVar33);
      }
      VVar32 = (ValueHolder)this->Config;
      if (*(long *)&((anon_struct_4_2_14fb5ae2_for_bits_ *)((ValueHolder *)&(VVar32.map_)->_M_t + 1)
                    )->field_0x0 != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_308,"-",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       VVar32.map_);
        std::__cxx11::string::_M_append(local_488,local_308.uint_);
        if (local_308 != &local_2f8) {
          operator_delete(local_308.string_,(ulong)(local_2f8.int_ + 1));
        }
        VVar32 = (ValueHolder)this->Config;
      }
      VVar34 = (ValueHolder)pDVar21->LocalGenerator;
      local_2f8 = local_3c0;
      local_4c0 = pDVar21;
      local_308 = VVar34;
      VStack_300 = VVar32;
      psVar29 = cmake::GetHomeDirectory_abi_cxx11_
                          ((cmake *)(*(_Base_ptr *)(VVar34.int_ + 0x88))[3]._M_right);
      local_2f0._0_8_ = local_2f0 + 0x10;
      pcVar11 = (psVar29->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2f0,pcVar11,pcVar11 + psVar29->_M_string_length);
      psVar29 = cmake::GetHomeOutputDirectory_abi_cxx11_
                          ((cmake *)(*(_Base_ptr *)(VVar34.int_ + 0x88))[3]._M_right);
      local_2d0.string_ = local_2c0;
      pcVar11 = (psVar29->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,pcVar11,pcVar11 + psVar29->_M_string_length);
      local_4f8.string_ = local_4e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f8,local_2f0._0_8_,(bool *)(local_2f0._8_8_ + local_2f0._0_8_));
      BacktraceData::BacktraceData((BacktraceData *)(local_2b8 + 8),(string *)&local_4f8);
      if (local_4f8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8) {
        operator_delete(local_4f8.string_,local_4e8._0_8_ + 1);
      }
      local_438 = (ValueHolder)this->FileAPI;
      Json::Value::Value((Value *)&local_428,objectValue);
      Json::Value::Value((Value *)&local_468,objectValue);
      psVar29 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_
                          ((cmLocalGenerator *)local_308.map_);
      cmSystemTools::RelativeIfUnder((string *)&local_4a8,(string *)local_2f0,psVar29);
      Json::Value::Value((Value *)&local_4f8,(String *)&local_4a8);
      pVVar20 = Json::Value::operator[]((Value *)&local_468,"source");
      Json::Value::operator=(pVVar20,(Value *)&local_4f8);
      Json::Value::~Value((Value *)&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_allocated_capacity != &local_498) {
        operator_delete((void *)local_4a8._M_allocated_capacity,
                        (ulong)(local_498._M_allocated_capacity + 1));
      }
      psVar29 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)local_308.map_);
      cmSystemTools::RelativeIfUnder((string *)&local_4a8,(string *)&local_2d0,psVar29);
      Json::Value::Value((Value *)&local_4f8,(String *)&local_4a8);
      pVVar20 = Json::Value::operator[]((Value *)&local_468,"build");
      Json::Value::operator=(pVVar20,(Value *)&local_4f8);
      Json::Value::~Value((Value *)&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_allocated_capacity != &local_498) {
        operator_delete((void *)local_4a8._M_allocated_capacity,
                        (ulong)(local_498._M_allocated_capacity + 1));
      }
      pVVar20 = Json::Value::operator[]((Value *)&local_428,"paths");
      Json::Value::operator=(pVVar20,(Value *)&local_468);
      Json::Value::~Value((Value *)&local_468);
      Json::Value::Value((Value *)&local_468,arrayValue);
      lVar33 = *(long *)&((ConfigAndLanguageToBTStrings *)(local_308.int_ + 0x70))->_M_t;
      puVar12 = *(undefined8 **)(lVar33 + 0x220);
      for (puVar45 = *(undefined8 **)(lVar33 + 0x218); puVar45 != puVar12; puVar45 = puVar45 + 1) {
        DirectoryObject::DumpInstaller
                  ((Value *)&local_4f8,(DirectoryObject *)&local_308,(cmInstallGenerator *)*puVar45)
        ;
        bVar16 = Json::Value::empty((Value *)&local_4f8);
        if (!bVar16) {
          Json::Value::append((Value *)&local_468,(Value *)&local_4f8);
        }
        Json::Value::~Value((Value *)&local_4f8);
      }
      pVVar20 = Json::Value::operator[]((Value *)&local_428,"installers");
      Json::Value::operator=(pVVar20,(Value *)&local_468);
      Json::Value::~Value((Value *)&local_468);
      BacktraceData::Dump((Value *)&local_4f8,(BacktraceData *)(local_2b8 + 8));
      pDVar21 = local_4c0;
      pVVar20 = Json::Value::operator[]((Value *)&local_428,"backtraceGraph");
      Json::Value::operator=(pVVar20,(Value *)&local_4f8);
      Json::Value::~Value((Value *)&local_4f8);
      cmFileAPI::MaybeJsonFile
                ((Value *)&local_3b8,(cmFileAPI *)local_438.map_,(Value *)&local_428,
                 (string *)local_488);
      Json::Value::~Value((Value *)&local_428);
      DirectoryObject::~DirectoryObject((DirectoryObject *)&local_308);
      if (local_388 != &local_378) {
        operator_delete(local_388.string_,(ulong)(local_378._M_allocated_capacity + 1));
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8.string_,local_3e8._M_allocated_capacity + 1);
      }
      if ((ValueHolder *)local_488._0_8_ != (ValueHolder *)(local_488 + 0x10)) {
        operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity + 1);
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_308,&pDVar21->Snapshot);
      psVar29 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&local_308);
      local_428._M_allocated_capacity = (size_type)local_418;
      pcVar11 = (psVar29->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_428,pcVar11,pcVar11 + psVar29->_M_string_length);
      cmSystemTools::RelativeIfUnder((string *)&local_4f8,(string *)local_430,(string *)&local_428);
      Json::Value::Value((Value *)&local_308,(String *)&local_4f8);
      pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"source");
      Json::Value::operator=(pVVar20,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      if (local_4f8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8) {
        operator_delete(local_4f8.string_,local_4e8._0_8_ + 1);
      }
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_308,&pDVar21->Snapshot);
      psVar29 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&local_308);
      local_4a8._M_allocated_capacity = (size_type)&local_498;
      pcVar11 = (psVar29->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a8,pcVar11,pcVar11 + psVar29->_M_string_length);
      cmSystemTools::RelativeIfUnder((string *)&local_4f8,(string *)local_4b0,(string *)&local_4a8);
      Json::Value::Value((Value *)&local_308,(String *)&local_4f8);
      pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"build");
      Json::Value::operator=(pVVar20,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      if (local_4f8 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8) {
        operator_delete(local_4f8.string_,local_4e8._0_8_ + 1);
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent
                ((cmStateSnapshot *)&local_3f8,&pDVar21->Snapshot);
      bVar16 = cmStateSnapshot::IsValid((cmStateSnapshot *)&local_3f8);
      if (bVar16) {
        local_4e8._0_8_ = local_3e8._M_allocated_capacity;
        local_4f8 = local_3f8;
        VStack_4f0 = VStack_3f0;
        iVar24 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_4f8);
        if ((ValueHolder *)iVar24._M_node == local_4b8) {
LAB_0052c69a:
          __assert_fail("i != this->DirectoryMap.end()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFileAPICodemodel.cxx"
                        ,0x280,
                        "Json::ArrayIndex (anonymous namespace)::CodemodelConfig::GetDirectoryIndex(cmStateSnapshot)"
                       );
        }
        Json::Value::Value((Value *)&local_308,*(UInt *)&iVar24._M_node[1]._M_right);
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"parentIndex");
        Json::Value::operator=(pVVar20,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      Json::Value::Value((Value *)&local_4f8,arrayValue);
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_488,
                 &pDVar21->Snapshot);
      uVar14 = local_488._8_8_;
      for (pVVar26 = (ValueHolder *)local_488._0_8_; pVVar26 != (ValueHolder *)uVar14;
          pVVar26 = pVVar26 + 3) {
        cmStateSnapshot::GetBuildsystemDirectory
                  ((cmStateSnapshot *)&local_388,(cmStateSnapshot *)pVVar26);
        local_458[0] = (ValueHolder)local_378._M_allocated_capacity;
        local_468._M_allocated_capacity = (size_type)local_388;
        local_468._8_8_ = VStack_380;
        iVar24 = std::
                 _Rb_tree<cmStateSnapshot,_std::pair<const_cmStateSnapshot,_unsigned_int>,_std::_Select1st<std::pair<const_cmStateSnapshot,_unsigned_int>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
                 ::find(&(this->DirectoryMap)._M_t,(key_type *)&local_468);
        if ((ValueHolder *)iVar24._M_node == local_4b8) goto LAB_0052c69a;
        Json::Value::Value((Value *)&local_308,*(UInt *)&iVar24._M_node[1]._M_right);
        Json::Value::append((Value *)&local_4f8,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      if ((ValueHolder *)local_488._0_8_ != (ValueHolder *)0x0) {
        operator_delete((void *)local_488._0_8_,local_478._M_allocated_capacity - local_488._0_8_);
      }
      bVar16 = Json::Value::empty((Value *)&local_4f8);
      pDVar21 = local_4c0;
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"childIndexes");
        Json::Value::operator=(pVVar20,(Value *)&local_4f8);
      }
      Json::Value::Value((Value *)&local_308,(UInt)*(size_t *)&pDVar21->ProjectIndex);
      pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"projectIndex");
      Json::Value::operator=(pVVar20,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      bVar16 = Json::Value::empty(&pDVar21->TargetIndexes);
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"targetIndexes");
        Json::Value::operator=(pVVar20,(Value *)&pDVar21->TargetIndexes);
      }
      local_478._M_allocated_capacity =
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&(pDVar21->Snapshot).Position.Position)->_M_allocated_capacity;
      local_488._0_8_ = (pDVar21->Snapshot).State;
      local_488._8_8_ = (pDVar21->Snapshot).Position.Tree;
      Json::Value::Value((Value *)&local_468,nullValue);
      local_308.string_ = (char *)&local_2f8;
      local_330 = (ValueHolder *)&DAT_0000001e;
      local_308.int_ = std::__cxx11::string::_M_create(&local_308.uint_,(ulong)&local_330);
      local_2f8.int_ = (LargestInt)local_330;
      builtin_strncpy((char *)((long)&(local_308.map_)->_M_t + 0xe),"REQUIRED",8);
      builtin_strncpy((char *)((long)&(local_308.map_)->_M_t + 0x16),"_VERSION",8);
      builtin_strncpy((char *)local_308,"CMAKE_MI",8);
      paVar15 = (anon_struct_4_2_14fb5ae2_for_bits_ *)((ValueHolder *)&(local_308.map_)->_M_t + 1);
      paVar15->field_0x0 = 'N';
      paVar15->field_0x1 = 'I';
      paVar15->field_0x2 = 'M';
      paVar15->field_0x3 = 'U';
      paVar15[1].field_0x0 = 'M';
      paVar15[1].field_0x1 = '_';
      paVar15[1].field_0x2 = 'R';
      paVar15[1].field_0x3 = 'E';
      VStack_300.int_ = (LargestInt)local_330;
      local_308.string_[(long)local_330] = false;
      value = cmStateSnapshot::GetDefinition((cmStateSnapshot *)local_488,(string *)&local_308);
      if (local_308 != &local_2f8) {
        operator_delete(local_308.string_,(ulong)(local_2f8.int_ + 1));
      }
      if (value.Value != (string *)0x0) {
        Json::Value::Value((Value *)&local_308,objectValue);
        Json::Value::operator=((Value *)&local_468,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
        Json::Value::Value((Value *)&local_308,value.Value);
        pVVar20 = Json::Value::operator[]((Value *)&local_468,"string");
        Json::Value::operator=(pVVar20,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      bVar16 = Json::Value::isNull((Value *)&local_468);
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"minimumCMakeVersion");
        Json::Value::operator=(pVVar20,(Value *)&local_468);
      }
      if (pDVar21->HasInstallRule == true) {
        Json::Value::Value((Value *)&local_308,true);
        pVVar20 = Json::Value::operator[]((Value *)&local_3b8,"hasInstallRule");
        Json::Value::operator=(pVVar20,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      Json::Value::~Value((Value *)&local_468);
      Json::Value::~Value((Value *)&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_allocated_capacity != &local_498) {
        operator_delete((void *)local_4a8._M_allocated_capacity,
                        (ulong)(local_498._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_allocated_capacity != local_418) {
        operator_delete((void *)local_428._M_allocated_capacity,
                        local_418[0]._M_allocated_capacity + 1);
      }
      Json::Value::append((Value *)&local_368,(Value *)&local_3b8);
      Json::Value::~Value((Value *)&local_3b8);
      pDVar21 = pDVar21 + 1;
    } while (pDVar21 != local_3d0);
  }
  pVVar20 = Json::Value::operator[](local_3c8,"directories");
  Json::Value::operator=(pVVar20,(Value *)&local_368);
  Json::Value::~Value((Value *)&local_368);
  Json::Value::Value((Value *)&local_468,arrayValue);
  pPVar35 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar13 = (this->Projects).
            super__Vector_base<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar35 != pPVar13) {
    do {
      Json::Value::Value((Value *)&local_4f8,objectValue);
      cmStateSnapshot::GetProjectName_abi_cxx11_((string *)&local_428,&pPVar35->Snapshot);
      Json::Value::Value((Value *)&local_308,(String *)&local_428);
      pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"name");
      Json::Value::operator=(pVVar20,(Value *)&local_308);
      Json::Value::~Value((Value *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_allocated_capacity != local_418) {
        operator_delete((void *)local_428._M_allocated_capacity,
                        local_418[0]._M_allocated_capacity + 1);
      }
      if (pPVar35->ParentIndex != 0xffffffff) {
        Json::Value::Value((Value *)&local_308,pPVar35->ParentIndex);
        pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"parentIndex");
        Json::Value::operator=(pVVar20,(Value *)&local_308);
        Json::Value::~Value((Value *)&local_308);
      }
      bVar16 = Json::Value::empty(&pPVar35->ChildIndexes);
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"childIndexes");
        Json::Value::operator=(pVVar20,&pPVar35->ChildIndexes);
      }
      pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"directoryIndexes");
      Json::Value::operator=(pVVar20,&pPVar35->DirectoryIndexes);
      bVar16 = Json::Value::empty(&pPVar35->TargetIndexes);
      if (!bVar16) {
        pVVar20 = Json::Value::operator[]((Value *)&local_4f8,"targetIndexes");
        Json::Value::operator=(pVVar20,&pPVar35->TargetIndexes);
      }
      Json::Value::append((Value *)&local_468,(Value *)&local_4f8);
      Json::Value::~Value((Value *)&local_4f8);
      pPVar35 = pPVar35 + 1;
    } while (pPVar35 != pPVar13);
  }
  pVVar20 = Json::Value::operator[](local_3c8,"projects");
  Json::Value::operator=(pVVar20,(Value *)&local_468);
  Json::Value::~Value((Value *)&local_468);
  return extraout_RAX;
}

Assistant:

Json::Value CodemodelConfig::Dump()
{
  Json::Value configuration = Json::objectValue;
  configuration["name"] = this->Config;
  this->ProcessDirectories();
  configuration["targets"] = this->DumpTargets();
  configuration["directories"] = this->DumpDirectories();
  configuration["projects"] = this->DumpProjects();
  return configuration;
}